

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void * duckdb_je_b0_alloc_tcache_stack(tsdn_t *tsdn,size_t stack_size)

{
  byte bVar1;
  uint uVar2;
  base_t *tsdn_00;
  base_t *base_00;
  ulong uVar3;
  edata_t *edata_00;
  long in_RSI;
  void *addr;
  size_t alloc_size;
  size_t header_size;
  size_t alignment;
  size_t esn;
  edata_t *edata;
  base_t *base;
  size_t ret;
  szind_t ret_1;
  size_t usize;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  size_t ret_2;
  base_t *in_stack_ffffffffffffff08;
  tsdn_t *in_stack_ffffffffffffff10;
  size_t *in_stack_ffffffffffffff18;
  size_t *in_stack_ffffffffffffff30;
  size_t in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  void *local_98;
  size_t *local_88;
  ulong local_20;
  size_t *local_18;
  
  tsdn_00 = duckdb_je_b0get();
  base_00 = (base_t *)base_alloc_base_edata(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (base_00 == (base_t *)0x0) {
    local_98 = (void *)0x0;
  }
  else {
    b0_alloc_header_size((size_t *)&stack0xffffffffffffff30,(size_t *)&stack0xffffffffffffff38);
    local_20 = in_RSI + (long)in_stack_ffffffffffffff30;
    if (local_20 < 0x1001) {
      local_88 = (size_t *)
                 duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[local_20 + 7 >> 3]];
    }
    else {
      if (local_20 < 0x7000000000000001) {
        if (local_20 == 0) {
          local_20 = 1;
        }
        if (local_20 < 9) {
          pow2_ceil_zu(0x24c924b);
          uVar2 = lg_floor(0x24c9253);
          if (uVar2 < 3) {
            bVar1 = 3;
          }
          else {
            bVar1 = (byte)uVar2 & 0x3f;
          }
          in_stack_ffffffffffffff18 = (size_t *)(1L << bVar1);
          local_18 = in_stack_ffffffffffffff18;
        }
        else {
          uVar2 = lg_floor(0x24c92c1);
          if ((ulong)uVar2 < 7) {
            in_stack_ffffffffffffff10 = (tsdn_t *)0x4;
          }
          else {
            in_stack_ffffffffffffff10 = (tsdn_t *)((ulong)uVar2 - 3);
          }
          uVar3 = (1L << ((byte)in_stack_ffffffffffffff10 & 0x3f)) - 1;
          local_18 = (size_t *)(local_20 + uVar3 & (uVar3 ^ 0xffffffffffffffff));
        }
      }
      else {
        local_18 = (size_t *)0x0;
      }
      local_88 = local_18;
    }
    edata_00 = (edata_t *)
               base_alloc_impl((tsdn_t *)tsdn_00,base_00,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,local_88);
    if (edata_00 == (edata_t *)0x0) {
      duckdb_je_edata_avail_insert
                ((edata_avail_t *)in_stack_ffffffffffffff10,(edata_t *)in_stack_ffffffffffffff08);
      local_98 = (void *)0x0;
    }
    else {
      edata_binit(edata_00,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10,
                  (uint64_t)in_stack_ffffffffffffff08,false);
      edata_00->e_bits = (uint64_t)base_00;
      local_98 = (void *)((long)&edata_00->e_bits + (long)in_stack_ffffffffffffff30);
    }
  }
  return local_98;
}

Assistant:

void *
b0_alloc_tcache_stack(tsdn_t *tsdn, size_t stack_size) {
	base_t *base = b0get();
	edata_t *edata = base_alloc_base_edata(tsdn, base);
	if (edata == NULL) {
		return NULL;
	}

	/*
	 * Reserve room for the header, which stores a pointer to the managing
	 * edata_t.  The header itself is located right before the return
	 * address, so that edata can be retrieved on dalloc.  Bump up to usize
	 * to improve reusability -- otherwise the freed stacks will be put back
	 * into the previous size class.
	 */
	size_t esn, alignment, header_size;
	b0_alloc_header_size(&header_size, &alignment);

	size_t alloc_size = sz_s2u(stack_size + header_size);
	void *addr = base_alloc_impl(tsdn, base, alloc_size, alignment, &esn,
	    NULL);
	if (addr == NULL) {
		edata_avail_insert(&base->edata_avail, edata);
		return NULL;
	}

	/* Set is_reused: see comments in base_edata_is_reused. */
	edata_binit(edata, addr, alloc_size, esn, true /* is_reused */);
	*(edata_t **)addr = edata;

	return (byte_t *)addr + header_size;
}